

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O3

string * __thiscall
soul::ASTUtilities::
getSpecialisationSignature<soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,4ul>,std::vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>>
          (string *__return_storage_ptr__,ASTUtilities *this,
          vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
          *params,ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *args)

{
  _Alloc_hider _Var1;
  string *psVar2;
  StructurePtr o;
  long lVar3;
  long lVar4;
  ASTObject *pAVar5;
  unsigned_long v;
  pointer ppVar6;
  Type targetType;
  stringstream key;
  string local_1f8;
  string *local_1d8;
  Type local_1d0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d8 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  lVar4 = *(long *)this;
  if (*(long *)(this + 8) != lVar4) {
    ppVar6 = (pointer)0x0;
    do {
      if (ppVar6 != (pointer)0x0) {
        local_1f8._M_dataplus._M_p._0_1_ = 0x2c;
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1f8,1);
      }
      lVar4 = *(long *)(lVar4 + (long)ppVar6 * 8);
      if (lVar4 == 0) {
LAB_001ec8b0:
        throwInternalCompilerError("getSpecialisationSignature",0xed);
      }
      lVar3 = __dynamic_cast(lVar4,&AST::ASTObject::typeinfo,&AST::UsingDeclaration::typeinfo,0);
      if (lVar3 == 0) {
        lVar3 = __dynamic_cast(lVar4,&AST::ASTObject::typeinfo,&AST::VariableDeclaration::typeinfo,0
                              );
        if (lVar3 == 0) {
          lVar3 = __dynamic_cast(lVar4,&AST::ASTObject::typeinfo,
                                 &AST::NamespaceAliasDeclaration::typeinfo,0);
          if (lVar3 == 0) {
            lVar4 = __dynamic_cast(lVar4,&AST::ASTObject::typeinfo,
                                   &AST::ProcessorAliasDeclaration::typeinfo,0);
            if (lVar4 == 0) goto LAB_001ec8b0;
            choc::text::createHexString<unsigned_long>
                      (&local_1f8,*(unsigned_long *)(lVar4 + 0x38),0);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
          }
          else {
            if (ppVar6 < (params->
                         super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish) {
              pAVar5 = (params->
                       super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[(long)ppVar6].object;
              if (pAVar5 == (ASTObject *)0x0) {
LAB_001ec921:
                throwInternalCompilerError("object != nullptr","operator->",0x3c);
              }
              lVar4 = __dynamic_cast(pAVar5,&AST::Expression::typeinfo,&AST::NamespaceRef::typeinfo,
                                     0);
              if (lVar4 == 0) goto LAB_001ec921;
              v = *(unsigned_long *)(lVar4 + 0x30);
            }
            else {
              v = *(unsigned_long *)(lVar3 + 0x40);
            }
            choc::text::createHexString<unsigned_long>(&local_1f8,v,0);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
          }
        }
        else {
          if (ppVar6 < (params->
                       super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish) {
            (*((params->
               super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
               )._M_impl.super__Vector_impl_data._M_start[(long)ppVar6].object)->_vptr_ASTObject
              [0xd])(&local_1f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              throwInternalCompilerError("object != nullptr","operator->",0x3c);
            }
          }
          else {
            if (*(long **)(lVar3 + 0x38) == (long *)0x0) {
              throwInternalCompilerError("object != nullptr","operator->",0x3c);
            }
            (**(code **)(**(long **)(lVar3 + 0x38) + 0x68))(&local_1f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              throwInternalCompilerError("object != nullptr","operator->",0x3c);
            }
          }
          _Var1._M_p = local_1f8._M_dataplus._M_p;
          if (*(long *)(local_1f8._M_dataplus._M_p + 0x58) == 0) {
            ArrayWithPreallocation<unsigned_char,_8UL>::resize
                      ((ArrayWithPreallocation<unsigned_char,_8UL> *)
                       (local_1f8._M_dataplus._M_p + 0x50),
                       *(size_t *)(local_1f8._M_dataplus._M_p + 0x48));
          }
          lVar4 = *(long *)(_Var1._M_p + 0x50);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1f8,lVar4,*(long *)(_Var1._M_p + 0x48) + lVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        if (ppVar6 < (params->
                     super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish) {
          pAVar5 = (params->
                   super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[(long)ppVar6].object;
        }
        else {
          pAVar5 = *(ASTObject **)(lVar3 + 0x38);
          if (pAVar5 == (ASTObject *)0x0) {
            throwInternalCompilerError("object != nullptr","operator->",0x3c);
          }
        }
        (*pAVar5->_vptr_ASTObject[5])(&local_1d0);
        o.object = local_1d0.structure.object;
        if (local_1d0.category == structure) {
          if (local_1d0.structure.object != (Structure *)0x0) {
            ((local_1d0.structure.object)->super_RefCountedObject).refCount =
                 ((local_1d0.structure.object)->super_RefCountedObject).refCount + 1;
          }
          choc::text::createHexString<unsigned_long>
                    (&local_1f8,(unsigned_long)local_1d0.structure.object,0);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          RefCountedPtr<soul::Structure>::decIfNotNull(o.object);
        }
        else {
          Type::getShortIdentifierDescription_abi_cxx11_(&local_1f8,&local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
        }
        RefCountedPtr<soul::Structure>::decIfNotNull(local_1d0.structure.object);
      }
      ppVar6 = (pointer)((long)&ppVar6->object + 1);
      lVar4 = *(long *)this;
    } while (ppVar6 < (pointer)(*(long *)(this + 8) - lVar4 >> 3));
  }
  psVar2 = local_1d8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

static std::string getSpecialisationSignature (const ParamList& params, const ArgList& args)
    {
        std::stringstream key;

        for (size_t i = 0; i < params.size(); ++i)
        {
            auto& param = params[i];

            if (i > 0)
                key << ',';

            if (auto u = cast<AST::UsingDeclaration> (param))
            {
                auto targetType = (i < args.size()) ? args[i]->resolveAsType() : u->targetType->resolveAsType();

                if (targetType.isStruct())
                    key << getSignatureString (targetType.getStruct().get());
                else
                    key << targetType.getShortIdentifierDescription();

                continue;
            }

            if (auto v = cast<AST::VariableDeclaration> (param))
            {
                auto& value = (i < args.size()) ?  args[i]->getAsConstant()->value : v->initialValue->getAsConstant()->value;
                key << std::string (static_cast<const char*> (value.getPackedData()), value.getPackedDataSize());
                continue;
            }

            if (auto v = cast<AST::NamespaceAliasDeclaration> (param))
            {
                auto ns = (i < args.size()) ? cast<AST::NamespaceRef> (args[i])->ns : v->resolvedNamespace;
                key << getSignatureString (ns.get());
                continue;
            }

            if (auto v = cast<AST::ProcessorAliasDeclaration> (param))
            {
                key << getSignatureString (v->resolvedProcessor.get());
                continue;
            }

            SOUL_ASSERT_FALSE;
        }

        return key.str();
    }